

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,GBufferFilm *p,FilmBaseParameters *args,
          RGBColorSpace **args_1,float *args_2,bool *args_3,polymorphic_allocator<std::byte> *args_4
          )

{
  undefined1 local_80 [80];
  
  pbrt::FilmBaseParameters::FilmBaseParameters((FilmBaseParameters *)local_80,args);
  pbrt::GBufferFilm::GBufferFilm
            (p,(FilmBaseParameters *)local_80,*args_1,*args_2,*args_3,args_4->memoryResource);
  std::__cxx11::string::~string((string *)(local_80 + 0x30));
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }